

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

TestFactoryBase * __thiscall
testing::internal::
TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
::CreateTestFactory(TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
                    *this,ParamType *parameter)

{
  ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
  *this_00;
  ExtensionDeclarationsTestParams local_38;
  ParamType *local_18;
  ParamType *parameter_local;
  TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
  *this_local;
  
  local_18 = parameter;
  parameter_local = (ParamType *)this;
  this_00 = (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
             *)operator_new(0x28);
  google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams::
  ExtensionDeclarationsTestParams(&local_38,parameter);
  ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
  ::ParameterizedTestFactory(this_00,&local_38);
  google::protobuf::descriptor_unittest::ExtensionDeclarationsTestParams::
  ~ExtensionDeclarationsTestParams(&local_38);
  return &this_00->super_TestFactoryBase;
}

Assistant:

TestFactoryBase* CreateTestFactory(ParamType parameter) override {
    return new ParameterizedTestFactory<TestSuite>(parameter);
  }